

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

int __thiscall mkvmuxer::Segment::WriteFramesAll(Segment *this)

{
  void *pvVar1;
  bool bVar2;
  long *plVar3;
  int64_t iVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  long in_RDI;
  uint64_t in_stack_00000008;
  uint64_t in_stack_00000010;
  Segment *in_stack_00000018;
  int result;
  Frame **frame;
  int32_t i;
  Cluster *cluster;
  Frame *in_stack_ffffffffffffff98;
  Cluster *in_stack_ffffffffffffffa0;
  Frame *in_stack_ffffffffffffffb0;
  int local_1c;
  int local_4;
  
  if (*(long *)(in_RDI + 0x130) == 0) {
    local_4 = 0;
  }
  else if (*(int *)(in_RDI + 0x114) < 1) {
    local_4 = -1;
  }
  else if (*(long *)(*(long *)(in_RDI + 0x108) + (long)(*(int *)(in_RDI + 0x114) + -1) * 8) == 0) {
    local_4 = -1;
  }
  else {
    for (local_1c = 0; local_1c < *(int *)(in_RDI + 0x13c); local_1c = local_1c + 1) {
      plVar3 = (long *)(*(long *)(in_RDI + 0x130) + (long)local_1c * 8);
      iVar4 = Frame::discard_padding((Frame *)*plVar3);
      if (iVar4 != 0) {
        *(undefined4 *)(in_RDI + 0x968) = 4;
      }
      bVar2 = Cluster::AddFrame(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      if (bVar2) {
        if (((*(byte *)(in_RDI + 0x94c) & 1) != 0) &&
           (uVar6 = *(uint64_t *)(in_RDI + 0x120), uVar5 = Frame::track_number((Frame *)*plVar3),
           uVar6 == uVar5)) {
          Frame::timestamp((Frame *)*plVar3);
          bVar2 = AddCuePoint(in_stack_00000018,in_stack_00000010,in_stack_00000008);
          if (!bVar2) {
            in_stack_ffffffffffffffb0 = (Frame *)*plVar3;
            if (in_stack_ffffffffffffffb0 != (Frame *)0x0) {
              Frame::~Frame(in_stack_ffffffffffffffb0);
              operator_delete(in_stack_ffffffffffffffb0);
            }
            goto LAB_00168647;
          }
        }
        uVar6 = Frame::timestamp((Frame *)*plVar3);
        if (*(ulong *)(in_RDI + 0x150) < uVar6) {
          uVar6 = Frame::timestamp((Frame *)*plVar3);
          *(uint64_t *)(in_RDI + 0x150) = uVar6;
          uVar6 = Frame::timestamp((Frame *)*plVar3);
          uVar5 = Frame::track_number((Frame *)*plVar3);
          *(uint64_t *)(in_RDI + 0x158 + (uVar5 - 1) * 8) = uVar6;
        }
        in_stack_ffffffffffffffa0 = (Cluster *)*plVar3;
        if (in_stack_ffffffffffffffa0 != (Cluster *)0x0) {
          Frame::~Frame(in_stack_ffffffffffffffb0);
          operator_delete(in_stack_ffffffffffffffa0);
        }
        *plVar3 = 0;
      }
      else {
        pvVar1 = (void *)*plVar3;
        if (pvVar1 != (void *)0x0) {
          Frame::~Frame(in_stack_ffffffffffffffb0);
          operator_delete(pvVar1);
        }
      }
LAB_00168647:
    }
    local_4 = *(int *)(in_RDI + 0x13c);
    *(undefined4 *)(in_RDI + 0x13c) = 0;
  }
  return local_4;
}

Assistant:

int Segment::WriteFramesAll() {
  if (frames_ == NULL)
    return 0;

  if (cluster_list_size_ < 1)
    return -1;

  Cluster* const cluster = cluster_list_[cluster_list_size_ - 1];

  if (!cluster)
    return -1;

  for (int32_t i = 0; i < frames_size_; ++i) {
    Frame*& frame = frames_[i];
    // TODO(jzern/vigneshv): using Segment::AddGenericFrame here would limit the
    // places where |doc_type_version_| needs to be updated.
    if (frame->discard_padding() != 0)
      doc_type_version_ = 4;
    if (!cluster->AddFrame(frame)) {
      delete frame;
      continue;
    }

    if (new_cuepoint_ && cues_track_ == frame->track_number()) {
      if (!AddCuePoint(frame->timestamp(), cues_track_)) {
        delete frame;
        continue;
      }
    }

    if (frame->timestamp() > last_timestamp_) {
      last_timestamp_ = frame->timestamp();
      last_track_timestamp_[frame->track_number() - 1] = frame->timestamp();
    }

    delete frame;
    frame = NULL;
  }

  const int result = frames_size_;
  frames_size_ = 0;

  return result;
}